

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void Logger::log_info(string *message,bool newline)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  poVar1 = std::operator<<((ostream *)&instance,"\x1b[0;36m[+] ");
  std::operator<<(poVar1,(string *)message);
  std::operator<<((ostream *)&instance,"\x1b[0m");
  if ((int)CONCAT71(in_register_00000031,newline) != 0) {
    std::operator<<((ostream *)&instance,"\n");
    return;
  }
  return;
}

Assistant:

void Logger::log_info(const std::string &message, bool newline) {
  instance.logfile << FC_CYAN "[+] " << message;
  instance.logfile << F_RESET;
  if (newline) instance.logfile << "\n";
}